

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O1

void __thiscall Assimp::AC3DImporter::Object::~Object(Object *this)

{
  pointer paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  std::vector<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>::
  ~vector(&this->surfaces);
  paVar1 = (this->vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1,(long)(this->vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar1);
  }
  pcVar2 = (this->texture)._M_dataplus._M_p;
  paVar3 = &(this->texture).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::~vector
            (&this->children);
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar3 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}